

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_derived_from(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                      lys_module *param_4,lyxp_set *set,int options)

{
  lyd_node *plVar1;
  lys_node *plVar2;
  long lVar3;
  char *ident_str;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  lyxp_set *plVar7;
  undefined *puVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  int local_34;
  
  if ((*args)->type < LYXP_SET_SNODE_SET) {
    iVar5 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    local_34 = -1;
    if (iVar5 == 0) {
      if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
        free((set->val).nodes);
      }
      set->type = LYXP_SET_BOOLEAN;
      (set->val).bool = 0;
      plVar7 = *args;
      local_34 = 0;
      if ((plVar7->type != LYXP_SET_EMPTY) && (plVar7->used != 0)) {
        uVar9 = 0;
        do {
          plVar1 = (plVar7->val).nodes[uVar9].node;
          plVar2 = plVar1->schema;
          if (((plVar2->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
             (iVar5._0_2_ = plVar2[1].flags, iVar5._2_1_ = plVar2[1].ext_size,
             iVar5._3_1_ = plVar2[1].iffeature_size, iVar5 == 7)) {
            uVar11 = (ulong)(plVar1[1].schema)->padding[3];
            if (uVar11 == 0) {
              uVar4 = 0;
              uVar10 = 0;
LAB_0016fc3e:
              if ((ushort)uVar10 < uVar4) {
                return 0;
              }
            }
            else {
              lVar3 = *(long *)&(plVar1[1].schema)->nodetype;
              ident_str = (args[1]->val).str;
              uVar10 = 0;
              do {
                iVar5 = xpath_derived_from_ident_cmp(*(lys_ident **)(lVar3 + uVar10 * 8),ident_str);
                if (iVar5 == 0) {
                  set->type = LYXP_SET_BOOLEAN;
                  (set->val).bool = 1;
                  uVar4 = (ushort)(plVar1[1].schema)->padding[3];
                  goto LAB_0016fc3e;
                }
                uVar10 = uVar10 + 1;
              } while (uVar11 != uVar10);
            }
            plVar7 = *args;
          }
          uVar9 = uVar9 + 1;
        } while ((uint)uVar9 < plVar7->used);
        local_34 = 0;
      }
    }
  }
  else {
    uVar6 = (*args)->type - LYXP_SET_SNODE_SET;
    if (uVar6 < 4) {
      puVar8 = (&PTR_anon_var_dwarf_61d77_001add30)[uVar6];
    }
    else {
      puVar8 = (undefined *)0x0;
    }
    ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,puVar8,"derived-from(node-set, string)");
    local_34 = -1;
  }
  return local_34;
}

Assistant:

static int
xpath_derived_from(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                   struct lyxp_set *set, int options)
{
    uint16_t i, j;
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "derived-from(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type != LYXP_SET_EMPTY) {
        for (i = 0; i < args[0]->used; ++i) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[i].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_IDENT)) {
                for (j = 0; j < leaf->value.ident->base_size; ++j) {
                    if (!xpath_derived_from_ident_cmp(leaf->value.ident->base[j], args[1]->val.str)) {
                        set_fill_boolean(set, 1);
                        break;
                    }
                }

                if (j < leaf->value.ident->base_size) {
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}